

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

MPP_RET notify(Kmpp *ctx,MppBufferGroup group)

{
  MPP_RET ret;
  MppBufferGroup group_local;
  Kmpp *ctx_local;
  
  return MPP_OK;
}

Assistant:

static MPP_RET notify(Kmpp *ctx, MppBufferGroup group)
{
    MPP_RET ret = MPP_OK;
    (void)group;

    switch (ctx->mType) {
    case MPP_CTX_DEC : {
    } break;
    default : {
    } break;
    }

    return ret;
}